

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int *piVar18;
  long lVar19;
  undefined1 auVar20 [16];
  void *pvVar21;
  int iVar22;
  uint _h;
  long lVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  uint _w;
  float *pfVar28;
  ulong uVar29;
  float *pfVar30;
  uint _elempack;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  ulong uVar33;
  float *pfVar34;
  long lVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  v4sf one;
  float fVar40;
  float fVar41;
  float fVar54;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  Mat bottom_blob_bordered;
  ulong local_110;
  Mat local_98;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar32 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  p_Var5 = this->_vptr_Convolution1D_x86[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar27 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86 + (long)this->_vptr_Convolution1D_x86[-3]),
             bottom_blob,&local_98,opt);
  iVar22 = local_98.h;
  iVar26 = -100;
  if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
    _elempack = 1;
    if (opt->use_packing_layout == true) {
      _elempack = (uint)(((&this->field_0xd0)[(long)this->_vptr_Convolution1D_x86[-3]] & 3) == 0) *
                  3 + 1;
    }
    uVar33 = (ulong)(uint)local_98.h;
    iVar4 = (local_98.w + ~((iVar4 + -1) * iVar27)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]);
    _w = iVar4 + 1;
    _h = *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / (int)_elempack;
    Mat::create(top_blob,_w,_h,(ulong)_elempack * (uVar32 / (ulong)(long)iVar3),_elempack,
                opt->blob_allocator);
    auVar20 = _DAT_003174b0;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((_elempack == 4 && iVar3 == 4) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_110 = 0;
        fVar37 = (float)DAT_003174b0;
        fVar38 = DAT_003174b0._4_4_;
        fVar39 = DAT_003174b0._8_4_;
        fVar40 = DAT_003174b0._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar31 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar26 = 0;
            iVar27 = 0;
            do {
              auVar47 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar69 = ZEXT816(0);
              }
              else {
                auVar69 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + local_110 * 0x10);
              }
              if (0 < iVar22) {
                pfVar34 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                pfVar30 = (float *)((long)local_98.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar26) * 4 +
                                   0xc);
                uVar32 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar28 = pfVar30;
                    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      fVar41 = pfVar28[-3];
                      fVar59 = pfVar28[-2];
                      fVar54 = pfVar28[-1];
                      fVar61 = *pfVar28;
                      fVar64 = auVar69._4_4_;
                      fVar65 = auVar69._8_4_;
                      fVar66 = auVar69._12_4_;
                      auVar69._0_4_ =
                           pfVar34[0xc] * fVar61 +
                           pfVar34[8] * fVar54 + pfVar34[4] * fVar59 +
                           *pfVar34 * fVar41 + auVar69._0_4_;
                      auVar69._4_4_ =
                           pfVar34[0xd] * fVar61 +
                           pfVar34[9] * fVar54 + pfVar34[5] * fVar59 + pfVar34[1] * fVar41 + fVar64;
                      auVar69._8_4_ =
                           pfVar34[0xe] * fVar61 +
                           pfVar34[10] * fVar54 + pfVar34[6] * fVar59 + pfVar34[2] * fVar41 + fVar65
                      ;
                      auVar69._12_4_ =
                           pfVar34[0xf] * fVar61 +
                           pfVar34[0xb] * fVar54 + pfVar34[7] * fVar59 +
                           pfVar34[3] * fVar41 + fVar66;
                      pfVar34 = pfVar34 + 0x10;
                      pfVar28 = pfVar28 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  uVar32 = uVar32 + 1;
                  pfVar30 = (float *)((long)pfVar30 +
                                     (long)local_98.w *
                                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                                     );
                } while (uVar32 != uVar33);
              }
              p_Var5 = pp_Var6[-3];
              fVar41 = auVar69._0_4_;
              fVar59 = auVar69._4_4_;
              fVar54 = auVar69._8_4_;
              fVar61 = auVar69._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar69 = maxps(auVar69,auVar47);
                break;
              case 2:
                auVar46 = maxps(auVar69,auVar47);
                auVar47 = minps(auVar69,auVar47);
                fVar41 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar69._4_4_ = fVar41 * auVar47._4_4_ + auVar46._4_4_;
                auVar69._0_4_ = fVar41 * auVar47._0_4_ + auVar46._0_4_;
                auVar69._8_4_ = fVar41 * auVar47._8_4_ + auVar46._8_4_;
                auVar69._12_4_ = fVar41 * auVar47._12_4_ + auVar46._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar44._4_4_ = uVar1;
                auVar44._0_4_ = uVar1;
                auVar44._8_4_ = uVar1;
                auVar44._12_4_ = uVar1;
                auVar47 = maxps(auVar69,auVar44);
                auVar14._4_4_ = uVar2;
                auVar14._0_4_ = uVar2;
                auVar14._8_4_ = uVar2;
                auVar14._12_4_ = uVar2;
                auVar69 = minps(auVar47,auVar14);
                break;
              case 4:
                auVar55._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
                auVar55._8_4_ = -fVar54;
                auVar55._12_4_ = -fVar61;
                auVar47 = minps(auVar55,_DAT_003174c0);
                auVar47 = maxps(auVar47,_DAT_003174d0);
                fVar59 = auVar47._0_4_ * 1.442695 + 0.5;
                fVar61 = auVar47._4_4_ * 1.442695 + 0.5;
                fVar65 = auVar47._8_4_ * 1.442695 + 0.5;
                fVar67 = auVar47._12_4_ * 1.442695 + 0.5;
                fVar41 = (float)(int)fVar59;
                fVar54 = (float)(int)fVar61;
                fVar64 = (float)(int)fVar65;
                fVar66 = (float)(int)fVar67;
                fVar41 = fVar41 - (float)(-(uint)(fVar59 < fVar41) & (uint)fVar37);
                fVar54 = fVar54 - (float)(-(uint)(fVar61 < fVar54) & (uint)fVar38);
                fVar64 = fVar64 - (float)(-(uint)(fVar65 < fVar64) & (uint)fVar39);
                fVar66 = fVar66 - (float)(-(uint)(fVar67 < fVar66) & (uint)fVar40);
                fVar59 = fVar41 * -0.6931472 + auVar47._0_4_;
                fVar61 = fVar54 * -0.6931472 + auVar47._4_4_;
                fVar65 = fVar64 * -0.6931472 + auVar47._8_4_;
                fVar67 = fVar66 * -0.6931472 + auVar47._12_4_;
                auVar45._0_4_ =
                     fVar59 + fVar37 +
                     (((((fVar59 * 0.00019875691 + 0.0013981999) * fVar59 + 0.008333452) * fVar59 +
                       0.041665796) * fVar59 + 0.16666666) * fVar59 + 0.5) * fVar59 * fVar59;
                auVar45._4_4_ =
                     fVar61 + fVar38 +
                     (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                       0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61;
                auVar45._8_4_ =
                     fVar65 + fVar39 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65;
                auVar45._12_4_ =
                     fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                fVar65 = (float)((int)fVar41 * 0x800000 + (int)fVar37) * auVar45._0_4_ + fVar37;
                fVar67 = (float)((int)fVar54 * 0x800000 + (int)fVar38) * auVar45._4_4_ + fVar38;
                fVar64 = (float)((int)fVar64 * 0x800000 + (int)fVar39) * auVar45._8_4_ + fVar39;
                fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar40) * auVar45._12_4_ + fVar40;
                auVar13._4_4_ = fVar67;
                auVar13._0_4_ = fVar65;
                auVar13._8_4_ = fVar64;
                auVar13._12_4_ = fVar66;
                auVar47 = rcpps(auVar45,auVar13);
                fVar41 = auVar47._0_4_;
                fVar59 = auVar47._4_4_;
                fVar54 = auVar47._8_4_;
                fVar61 = auVar47._12_4_;
                auVar69._0_4_ = (fVar37 - fVar65 * fVar41) * fVar41 + fVar41;
                auVar69._4_4_ = (fVar38 - fVar67 * fVar59) * fVar59 + fVar59;
                auVar69._8_4_ = (fVar39 - fVar64 * fVar54) * fVar54 + fVar54;
                auVar69._12_4_ = (fVar40 - fVar66 * fVar61) * fVar61 + fVar61;
                break;
              case 5:
                auVar47 = minps(auVar69,_DAT_003174c0);
                auVar47 = maxps(auVar47,_DAT_003174d0);
                fVar64 = auVar47._0_4_ * 1.442695 + 0.5;
                fVar65 = auVar47._4_4_ * 1.442695 + 0.5;
                fVar66 = auVar47._8_4_ * 1.442695 + 0.5;
                fVar67 = auVar47._12_4_ * 1.442695 + 0.5;
                fVar58 = (float)(int)fVar64;
                fVar60 = (float)(int)fVar65;
                fVar62 = (float)(int)fVar66;
                fVar63 = (float)(int)fVar67;
                fVar58 = fVar58 - (float)(-(uint)(fVar64 < fVar58) & (uint)fVar37);
                fVar60 = fVar60 - (float)(-(uint)(fVar65 < fVar60) & (uint)fVar38);
                fVar62 = fVar62 - (float)(-(uint)(fVar66 < fVar62) & (uint)fVar39);
                fVar63 = fVar63 - (float)(-(uint)(fVar67 < fVar63) & (uint)fVar40);
                fVar64 = auVar47._0_4_ - fVar58 * 0.6931472;
                fVar65 = auVar47._4_4_ - fVar60 * 0.6931472;
                fVar66 = auVar47._8_4_ - fVar62 * 0.6931472;
                fVar67 = auVar47._12_4_ - fVar63 * 0.6931472;
                auVar68._0_4_ =
                     (float)((int)fVar58 * 0x800000 + (int)fVar37) *
                     (fVar64 + fVar37 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64) +
                     fVar37;
                auVar68._4_4_ =
                     (float)((int)fVar60 * 0x800000 + (int)fVar38) *
                     (fVar65 + fVar38 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65) +
                     fVar38;
                auVar68._8_4_ =
                     (float)((int)fVar62 * 0x800000 + (int)fVar39) *
                     (fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) +
                     fVar39;
                auVar68._12_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar40) *
                     (fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67) +
                     fVar40;
                auVar69 = maxps(auVar68,_DAT_00317560);
                fVar64 = (float)(auVar69._0_4_ & 0x807fffff | 0x3f000000);
                fVar66 = (float)(auVar69._4_4_ & 0x807fffff | 0x3f000000);
                fVar58 = (float)(auVar69._8_4_ & 0x807fffff | 0x3f000000);
                fVar62 = (float)(auVar69._12_4_ & 0x807fffff | 0x3f000000);
                fVar65 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                fVar67 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                fVar60 = fVar58 + -1.0 + (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
                fVar63 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
                auVar42._0_8_ =
                     CONCAT44(-(uint)(auVar68._4_4_ <= 0.0),-(uint)(auVar68._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar42._8_4_ = -(uint)(auVar68._8_4_ <= 0.0) & 0x7fffffff;
                auVar42._12_4_ = -(uint)(auVar68._12_4_ <= 0.0) & 0x7fffffff;
                auVar47._4_4_ =
                     ~-(uint)(auVar68._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar38)) * 0.6931472 +
                             fVar67 + (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 +
                                             0.116769984) * fVar67 + -0.12420141) * fVar67 +
                                           0.14249323) * fVar67 + -0.16668057) * fVar67 + 0.20000714
                                         ) * fVar67 + -0.24999994) * fVar67 + 0.3333333) * fVar67 +
                                      -0.5) * fVar67 * fVar67) * -2.0);
                auVar47._0_4_ =
                     ~-(uint)(auVar68._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar37)) * 0.6931472 +
                             fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                             0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                           0.14249323) * fVar65 + -0.16668057) * fVar65 + 0.20000714
                                         ) * fVar65 + -0.24999994) * fVar65 + 0.3333333) * fVar65 +
                                      -0.5) * fVar65 * fVar65) * -2.0);
                auVar47._8_4_ =
                     ~-(uint)(auVar68._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar39)) * 0.6931472 +
                             fVar60 + (((((((((fVar60 * 0.070376836 + -0.1151461) * fVar60 +
                                             0.116769984) * fVar60 + -0.12420141) * fVar60 +
                                           0.14249323) * fVar60 + -0.16668057) * fVar60 + 0.20000714
                                         ) * fVar60 + -0.24999994) * fVar60 + 0.3333333) * fVar60 +
                                      -0.5) * fVar60 * fVar60) * -2.0);
                auVar47._12_4_ =
                     ~-(uint)(auVar68._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar40)) * 0.6931472 +
                             fVar63 + (((((((((fVar63 * 0.070376836 + -0.1151461) * fVar63 +
                                             0.116769984) * fVar63 + -0.12420141) * fVar63 +
                                           0.14249323) * fVar63 + -0.16668057) * fVar63 + 0.20000714
                                         ) * fVar63 + -0.24999994) * fVar63 + 0.3333333) * fVar63 +
                                      -0.5) * fVar63 * fVar63) * -2.0);
                auVar47 = minps(auVar42 | auVar47,_DAT_003174c0);
                auVar47 = maxps(auVar47,_DAT_003174d0);
                fVar64 = auVar47._0_4_ * 1.442695 + 0.5;
                fVar65 = auVar47._4_4_ * 1.442695 + 0.5;
                fVar66 = auVar47._8_4_ * 1.442695 + 0.5;
                fVar67 = auVar47._12_4_ * 1.442695 + 0.5;
                fVar58 = (float)(int)fVar64;
                fVar60 = (float)(int)fVar65;
                fVar62 = (float)(int)fVar66;
                fVar63 = (float)(int)fVar67;
                fVar58 = fVar58 - (float)(-(uint)(fVar64 < fVar58) & (uint)fVar37);
                fVar60 = fVar60 - (float)(-(uint)(fVar65 < fVar60) & (uint)fVar38);
                fVar62 = fVar62 - (float)(-(uint)(fVar66 < fVar62) & (uint)fVar39);
                fVar63 = fVar63 - (float)(-(uint)(fVar67 < fVar63) & (uint)fVar40);
                fVar64 = auVar47._0_4_ - fVar58 * 0.6931472;
                fVar65 = auVar47._4_4_ - fVar60 * 0.6931472;
                fVar66 = auVar47._8_4_ - fVar62 * 0.6931472;
                fVar67 = auVar47._12_4_ - fVar63 * 0.6931472;
                auVar43._0_4_ =
                     fVar64 + fVar37 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64;
                auVar43._4_4_ =
                     fVar65 + fVar38 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65;
                auVar43._8_4_ =
                     fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                auVar43._12_4_ =
                     fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                fVar58 = (float)((int)fVar58 * 0x800000 + (int)fVar37) * auVar43._0_4_ + fVar37;
                fVar60 = (float)((int)fVar60 * 0x800000 + (int)fVar38) * auVar43._4_4_ + fVar38;
                fVar62 = (float)((int)fVar62 * 0x800000 + (int)fVar39) * auVar43._8_4_ + fVar39;
                fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar40) * auVar43._12_4_ + fVar40;
                auVar52._4_4_ = fVar60;
                auVar52._0_4_ = fVar58;
                auVar52._8_4_ = fVar62;
                auVar52._12_4_ = fVar63;
                auVar47 = rcpps(auVar43,auVar52);
                fVar64 = auVar47._0_4_;
                fVar65 = auVar47._4_4_;
                fVar66 = auVar47._8_4_;
                fVar67 = auVar47._12_4_;
                auVar69._0_4_ =
                     fVar41 * (fVar64 + fVar64 + -1.0 + (2.0 - fVar58 * (fVar64 + fVar64)) * fVar64)
                ;
                auVar69._4_4_ =
                     fVar59 * (fVar65 + fVar65 + -1.0 + (2.0 - fVar60 * (fVar65 + fVar65)) * fVar65)
                ;
                auVar69._8_4_ =
                     fVar54 * (fVar66 + fVar66 + -1.0 + (2.0 - fVar62 * (fVar66 + fVar66)) * fVar66)
                ;
                auVar69._12_4_ =
                     fVar61 * (fVar67 + fVar67 + -1.0 + (2.0 - fVar63 * (fVar67 + fVar67)) * fVar67)
                ;
                break;
              case 6:
                fVar64 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar65 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar46._0_4_ = fVar64 * fVar41 + fVar65;
                auVar46._4_4_ = fVar64 * fVar59 + fVar65;
                auVar46._8_4_ = fVar64 * fVar54 + fVar65;
                auVar46._12_4_ = fVar64 * fVar61 + fVar65;
                auVar47 = maxps(auVar46,auVar47);
                auVar47 = minps(auVar47,auVar20);
                auVar69._0_4_ = fVar41 * auVar47._0_4_;
                auVar69._4_4_ = fVar59 * auVar47._4_4_;
                auVar69._8_4_ = fVar54 * auVar47._8_4_;
                auVar69._12_4_ = fVar61 * auVar47._12_4_;
              }
              *pauVar31 = auVar69;
              pauVar31 = pauVar31 + 1;
              iVar26 = iVar26 + 4;
              bVar36 = iVar27 != iVar4;
              iVar27 = iVar27 + 1;
            } while (bVar36);
          }
          local_110 = local_110 + 1;
        } while (local_110 != _h);
      }
      auVar69 = _DAT_003174d0;
      auVar47 = _DAT_003174c0;
      auVar20 = _DAT_003174b0;
      if ((_elempack == 4 && iVar3 == 1) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar32 = 0;
        fVar37 = (float)DAT_003174b0;
        fVar38 = DAT_003174b0._4_4_;
        fVar39 = DAT_003174b0._8_4_;
        fVar40 = DAT_003174b0._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar31 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar27 = 0;
            do {
              auVar46 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar56 = ZEXT816(0);
              }
              else {
                auVar56 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar32 * 0x10);
              }
              if (0 < iVar22) {
                pfVar30 = (float *)((this->weight_data_packed).cstep * uVar32 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                pfVar34 = (float *)((long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar27) * 4
                                   + (long)local_98.data);
                uVar25 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar28 = pfVar34;
                    auVar52 = auVar56;
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      fVar41 = *pfVar28;
                      auVar56._0_4_ = auVar52._0_4_ + *pfVar30 * fVar41;
                      auVar56._4_4_ = auVar52._4_4_ + pfVar30[1] * fVar41;
                      auVar56._8_4_ = auVar52._8_4_ + pfVar30[2] * fVar41;
                      auVar56._12_4_ = auVar52._12_4_ + pfVar30[3] * fVar41;
                      pfVar30 = pfVar30 + 4;
                      pfVar28 = pfVar28 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar26 = iVar26 + -1;
                      auVar52 = auVar56;
                    } while (iVar26 != 0);
                  }
                  uVar25 = uVar25 + 1;
                  pfVar34 = (float *)((long)pfVar34 +
                                     (long)local_98.w *
                                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                                     );
                } while (uVar25 != uVar33);
              }
              p_Var5 = pp_Var6[-3];
              fVar41 = auVar56._0_4_;
              fVar59 = auVar56._4_4_;
              fVar54 = auVar56._8_4_;
              fVar61 = auVar56._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar56 = maxps(auVar56,auVar46);
                break;
              case 2:
                auVar52 = maxps(auVar56,auVar46);
                auVar46 = minps(auVar56,auVar46);
                fVar41 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar56._4_4_ = fVar41 * auVar46._4_4_ + auVar52._4_4_;
                auVar56._0_4_ = fVar41 * auVar46._0_4_ + auVar52._0_4_;
                auVar56._8_4_ = fVar41 * auVar46._8_4_ + auVar52._8_4_;
                auVar56._12_4_ = fVar41 * auVar46._12_4_ + auVar52._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar50._4_4_ = uVar1;
                auVar50._0_4_ = uVar1;
                auVar50._8_4_ = uVar1;
                auVar50._12_4_ = uVar1;
                auVar46 = maxps(auVar56,auVar50);
                auVar16._4_4_ = uVar2;
                auVar16._0_4_ = uVar2;
                auVar16._8_4_ = uVar2;
                auVar16._12_4_ = uVar2;
                auVar56 = minps(auVar46,auVar16);
                break;
              case 4:
                auVar57._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
                auVar57._8_4_ = -fVar54;
                auVar57._12_4_ = -fVar61;
                auVar46 = minps(auVar57,auVar47);
                auVar46 = maxps(auVar46,auVar69);
                fVar59 = auVar46._0_4_ * 1.442695 + 0.5;
                fVar61 = auVar46._4_4_ * 1.442695 + 0.5;
                fVar65 = auVar46._8_4_ * 1.442695 + 0.5;
                fVar67 = auVar46._12_4_ * 1.442695 + 0.5;
                fVar41 = (float)(int)fVar59;
                fVar54 = (float)(int)fVar61;
                fVar64 = (float)(int)fVar65;
                fVar66 = (float)(int)fVar67;
                fVar41 = fVar41 - (float)(-(uint)(fVar59 < fVar41) & (uint)fVar37);
                fVar54 = fVar54 - (float)(-(uint)(fVar61 < fVar54) & (uint)fVar38);
                fVar64 = fVar64 - (float)(-(uint)(fVar65 < fVar64) & (uint)fVar39);
                fVar66 = fVar66 - (float)(-(uint)(fVar67 < fVar66) & (uint)fVar40);
                fVar59 = fVar41 * -0.6931472 + auVar46._0_4_;
                fVar61 = fVar54 * -0.6931472 + auVar46._4_4_;
                fVar65 = fVar64 * -0.6931472 + auVar46._8_4_;
                fVar67 = fVar66 * -0.6931472 + auVar46._12_4_;
                auVar51._0_4_ =
                     fVar59 + fVar37 +
                     (((((fVar59 * 0.00019875691 + 0.0013981999) * fVar59 + 0.008333452) * fVar59 +
                       0.041665796) * fVar59 + 0.16666666) * fVar59 + 0.5) * fVar59 * fVar59;
                auVar51._4_4_ =
                     fVar61 + fVar38 +
                     (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                       0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61;
                auVar51._8_4_ =
                     fVar65 + fVar39 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65;
                auVar51._12_4_ =
                     fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                fVar65 = (float)((int)fVar41 * 0x800000 + (int)fVar37) * auVar51._0_4_ + fVar37;
                fVar67 = (float)((int)fVar54 * 0x800000 + (int)fVar38) * auVar51._4_4_ + fVar38;
                fVar64 = (float)((int)fVar64 * 0x800000 + (int)fVar39) * auVar51._8_4_ + fVar39;
                fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar40) * auVar51._12_4_ + fVar40;
                auVar15._4_4_ = fVar67;
                auVar15._0_4_ = fVar65;
                auVar15._8_4_ = fVar64;
                auVar15._12_4_ = fVar66;
                auVar46 = rcpps(auVar51,auVar15);
                fVar41 = auVar46._0_4_;
                fVar59 = auVar46._4_4_;
                fVar54 = auVar46._8_4_;
                fVar61 = auVar46._12_4_;
                auVar56._0_4_ = (fVar37 - fVar65 * fVar41) * fVar41 + fVar41;
                auVar56._4_4_ = (fVar38 - fVar67 * fVar59) * fVar59 + fVar59;
                auVar56._8_4_ = (fVar39 - fVar64 * fVar54) * fVar54 + fVar54;
                auVar56._12_4_ = (fVar40 - fVar66 * fVar61) * fVar61 + fVar61;
                break;
              case 5:
                auVar46 = minps(auVar56,auVar47);
                auVar46 = maxps(auVar46,auVar69);
                fVar64 = auVar46._0_4_ * 1.442695 + 0.5;
                fVar65 = auVar46._4_4_ * 1.442695 + 0.5;
                fVar66 = auVar46._8_4_ * 1.442695 + 0.5;
                fVar67 = auVar46._12_4_ * 1.442695 + 0.5;
                fVar58 = (float)(int)fVar64;
                fVar60 = (float)(int)fVar65;
                fVar62 = (float)(int)fVar66;
                fVar63 = (float)(int)fVar67;
                fVar58 = fVar58 - (float)(-(uint)(fVar64 < fVar58) & (uint)fVar37);
                fVar60 = fVar60 - (float)(-(uint)(fVar65 < fVar60) & (uint)fVar38);
                fVar62 = fVar62 - (float)(-(uint)(fVar66 < fVar62) & (uint)fVar39);
                fVar63 = fVar63 - (float)(-(uint)(fVar67 < fVar63) & (uint)fVar40);
                fVar64 = auVar46._0_4_ - fVar58 * 0.6931472;
                fVar65 = auVar46._4_4_ - fVar60 * 0.6931472;
                fVar66 = auVar46._8_4_ - fVar62 * 0.6931472;
                fVar67 = auVar46._12_4_ - fVar63 * 0.6931472;
                auVar70._0_4_ =
                     (float)((int)fVar58 * 0x800000 + (int)fVar37) *
                     (fVar64 + fVar37 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64) +
                     fVar37;
                auVar70._4_4_ =
                     (float)((int)fVar60 * 0x800000 + (int)fVar38) *
                     (fVar65 + fVar38 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65) +
                     fVar38;
                auVar70._8_4_ =
                     (float)((int)fVar62 * 0x800000 + (int)fVar39) *
                     (fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) +
                     fVar39;
                auVar70._12_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar40) *
                     (fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67) +
                     fVar40;
                auVar46 = maxps(auVar70,_DAT_00317560);
                fVar64 = (float)(auVar46._0_4_ & 0x807fffff | 0x3f000000);
                fVar66 = (float)(auVar46._4_4_ & 0x807fffff | 0x3f000000);
                fVar58 = (float)(auVar46._8_4_ & 0x807fffff | 0x3f000000);
                fVar62 = (float)(auVar46._12_4_ & 0x807fffff | 0x3f000000);
                fVar65 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                fVar67 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                fVar60 = fVar58 + -1.0 + (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
                fVar63 = fVar62 + -1.0 + (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar62);
                auVar48._0_8_ =
                     CONCAT44(-(uint)(auVar70._4_4_ <= 0.0),-(uint)(auVar70._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar48._8_4_ = -(uint)(auVar70._8_4_ <= 0.0) & 0x7fffffff;
                auVar48._12_4_ = -(uint)(auVar70._12_4_ <= 0.0) & 0x7fffffff;
                auVar12._4_4_ =
                     ~-(uint)(auVar70._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar46._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar38)) * 0.6931472 +
                             fVar67 + (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 +
                                             0.116769984) * fVar67 + -0.12420141) * fVar67 +
                                           0.14249323) * fVar67 + -0.16668057) * fVar67 + 0.20000714
                                         ) * fVar67 + -0.24999994) * fVar67 + 0.3333333) * fVar67 +
                                      -0.5) * fVar67 * fVar67) * -2.0);
                auVar12._0_4_ =
                     ~-(uint)(auVar70._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar46._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar37)) * 0.6931472 +
                             fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                             0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                           0.14249323) * fVar65 + -0.16668057) * fVar65 + 0.20000714
                                         ) * fVar65 + -0.24999994) * fVar65 + 0.3333333) * fVar65 +
                                      -0.5) * fVar65 * fVar65) * -2.0);
                auVar12._8_4_ =
                     ~-(uint)(auVar70._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar46._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar39)) * 0.6931472 +
                             fVar60 + (((((((((fVar60 * 0.070376836 + -0.1151461) * fVar60 +
                                             0.116769984) * fVar60 + -0.12420141) * fVar60 +
                                           0.14249323) * fVar60 + -0.16668057) * fVar60 + 0.20000714
                                         ) * fVar60 + -0.24999994) * fVar60 + 0.3333333) * fVar60 +
                                      -0.5) * fVar60 * fVar60) * -2.0);
                auVar12._12_4_ =
                     ~-(uint)(auVar70._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar46._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar62 < 0.70710677) & (uint)fVar40)) * 0.6931472 +
                             fVar63 + (((((((((fVar63 * 0.070376836 + -0.1151461) * fVar63 +
                                             0.116769984) * fVar63 + -0.12420141) * fVar63 +
                                           0.14249323) * fVar63 + -0.16668057) * fVar63 + 0.20000714
                                         ) * fVar63 + -0.24999994) * fVar63 + 0.3333333) * fVar63 +
                                      -0.5) * fVar63 * fVar63) * -2.0);
                auVar46 = minps(auVar48 | auVar12,auVar47);
                auVar46 = maxps(auVar46,auVar69);
                fVar64 = auVar46._0_4_ * 1.442695 + 0.5;
                fVar65 = auVar46._4_4_ * 1.442695 + 0.5;
                fVar66 = auVar46._8_4_ * 1.442695 + 0.5;
                fVar67 = auVar46._12_4_ * 1.442695 + 0.5;
                fVar58 = (float)(int)fVar64;
                fVar60 = (float)(int)fVar65;
                fVar62 = (float)(int)fVar66;
                fVar63 = (float)(int)fVar67;
                fVar58 = fVar58 - (float)(-(uint)(fVar64 < fVar58) & (uint)fVar37);
                fVar60 = fVar60 - (float)(-(uint)(fVar65 < fVar60) & (uint)fVar38);
                fVar62 = fVar62 - (float)(-(uint)(fVar66 < fVar62) & (uint)fVar39);
                fVar63 = fVar63 - (float)(-(uint)(fVar67 < fVar63) & (uint)fVar40);
                fVar64 = auVar46._0_4_ - fVar58 * 0.6931472;
                fVar65 = auVar46._4_4_ - fVar60 * 0.6931472;
                fVar66 = auVar46._8_4_ - fVar62 * 0.6931472;
                fVar67 = auVar46._12_4_ - fVar63 * 0.6931472;
                auVar49._0_4_ =
                     fVar64 + fVar37 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64;
                auVar49._4_4_ =
                     fVar65 + fVar38 +
                     (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65 +
                       0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65;
                auVar49._8_4_ =
                     fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                auVar49._12_4_ =
                     fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                fVar58 = (float)((int)fVar58 * 0x800000 + (int)fVar37) * auVar49._0_4_ + fVar37;
                fVar60 = (float)((int)fVar60 * 0x800000 + (int)fVar38) * auVar49._4_4_ + fVar38;
                fVar62 = (float)((int)fVar62 * 0x800000 + (int)fVar39) * auVar49._8_4_ + fVar39;
                fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar40) * auVar49._12_4_ + fVar40;
                auVar17._4_4_ = fVar60;
                auVar17._0_4_ = fVar58;
                auVar17._8_4_ = fVar62;
                auVar17._12_4_ = fVar63;
                auVar46 = rcpps(auVar49,auVar17);
                fVar64 = auVar46._0_4_;
                fVar65 = auVar46._4_4_;
                fVar66 = auVar46._8_4_;
                fVar67 = auVar46._12_4_;
                auVar56._0_4_ =
                     fVar41 * (fVar64 + fVar64 + -1.0 + (2.0 - fVar58 * (fVar64 + fVar64)) * fVar64)
                ;
                auVar56._4_4_ =
                     fVar59 * (fVar65 + fVar65 + -1.0 + (2.0 - fVar60 * (fVar65 + fVar65)) * fVar65)
                ;
                auVar56._8_4_ =
                     fVar54 * (fVar66 + fVar66 + -1.0 + (2.0 - fVar62 * (fVar66 + fVar66)) * fVar66)
                ;
                auVar56._12_4_ =
                     fVar61 * (fVar67 + fVar67 + -1.0 + (2.0 - fVar63 * (fVar67 + fVar67)) * fVar67)
                ;
                break;
              case 6:
                fVar64 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar65 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar53._0_4_ = fVar64 * fVar41 + fVar65;
                auVar53._4_4_ = fVar64 * fVar59 + fVar65;
                auVar53._8_4_ = fVar64 * fVar54 + fVar65;
                auVar53._12_4_ = fVar64 * fVar61 + fVar65;
                auVar46 = maxps(auVar53,auVar46);
                auVar46 = minps(auVar46,auVar20);
                auVar56._0_4_ = fVar41 * auVar46._0_4_;
                auVar56._4_4_ = fVar59 * auVar46._4_4_;
                auVar56._8_4_ = fVar54 * auVar46._8_4_;
                auVar56._12_4_ = fVar61 * auVar46._12_4_;
              }
              *pauVar31 = auVar56;
              pauVar31 = pauVar31 + 1;
              bVar36 = iVar27 != iVar4;
              iVar27 = iVar27 + 1;
            } while (bVar36);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != _h);
      }
      if ((iVar3 == 4 && (_elempack ^ 1) == 0) && 0 < (int)_h) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_38 = (ulong)_h;
        uVar32 = 0;
        do {
          pvVar21 = local_40;
          pvVar11 = local_98.data;
          if (-1 < iVar4) {
            lVar23 = local_48 * uVar32;
            lVar35 = (long)local_98.w;
            lVar19 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            sVar8 = (this->weight_data_packed).cstep;
            sVar9 = (this->weight_data_packed).elemsize;
            pvVar10 = (this->weight_data_packed).data;
            iVar27 = 0;
            uVar25 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                fVar37 = 0.0;
              }
              else {
                fVar37 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar32 * 4);
              }
              if (0 < iVar22) {
                p_Var5 = pp_Var7[-3];
                pfVar30 = (float *)((long)pvVar11 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar27) * 4);
                uVar29 = 0;
                pfVar34 = (float *)(sVar8 * uVar32 * sVar9 + (long)pvVar10);
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar28 = pfVar30;
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      fVar37 = pfVar34[3] * pfVar28[3] + pfVar34[1] * pfVar28[1] +
                               fVar37 + pfVar34[2] * pfVar28[2] + *pfVar34 * *pfVar28;
                      pfVar34 = pfVar34 + 4;
                      pfVar28 = pfVar28 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar29 = uVar29 + 1;
                  pfVar30 = (float *)((long)pfVar30 + lVar35 * lVar19);
                } while (uVar29 != uVar33);
              }
              p_Var5 = pp_Var6[-3];
              fVar38 = fVar37;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar37 <= 0.0) {
                  fVar38 = 0.0;
                }
                break;
              case 2:
                fVar38 = (float)(-(uint)(0.0 < fVar37) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar37) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar37;
                break;
              case 3:
                fVar38 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar37 <= fVar38) {
                  fVar37 = fVar38;
                }
                fVar39 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar38 = fVar37;
                if (fVar39 <= fVar37) {
                  fVar38 = fVar39;
                }
                break;
              case 4:
                fVar37 = expf(-fVar37);
                fVar38 = 1.0 / (fVar37 + 1.0);
                break;
              case 5:
                fVar38 = expf(fVar37);
                fVar38 = logf(fVar38 + 1.0);
                fVar38 = tanhf(fVar38);
                fVar38 = fVar38 * fVar37;
                break;
              case 6:
                fVar39 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar40 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar41 = -fVar40 / fVar39;
                fVar38 = 0.0;
                if ((fVar41 <= fVar37) && (fVar38 = fVar37, fVar37 <= fVar41 + 1.0 / fVar39)) {
                  fVar38 = (fVar39 * fVar37 + fVar40) * fVar37;
                }
              }
              *(float *)((long)pvVar21 + uVar25 * 4 + lVar23) = fVar38;
              uVar25 = uVar25 + 1;
              iVar27 = iVar27 + 4;
            } while (uVar25 != _w);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != local_38);
      }
      if (((_elempack ^ 1) == 0 && iVar3 == 1) && 0 < (int)_h) {
        pvVar11 = top_blob->data;
        iVar3 = top_blob->w;
        sVar8 = top_blob->elemsize;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar32 = 0;
        do {
          pvVar21 = local_98.data;
          if (-1 < iVar4) {
            lVar23 = (long)local_98.w;
            lVar19 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
            uVar25 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                fVar37 = 0.0;
              }
              else {
                fVar37 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar32 * 4);
              }
              if (0 < iVar22) {
                iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                pfVar34 = (float *)((long)((int)uVar32 * iVar22 * iVar27) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var5));
                pfVar30 = (float *)((long)pvVar21 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * (int)uVar25)
                                   * 4);
                uVar29 = 0;
                do {
                  if (0 < iVar27) {
                    pfVar28 = pfVar30;
                    iVar26 = iVar27;
                    do {
                      fVar37 = fVar37 + *pfVar34 * *pfVar28;
                      pfVar34 = pfVar34 + 1;
                      pfVar28 = pfVar28 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar29 = uVar29 + 1;
                  pfVar30 = (float *)((long)pfVar30 + lVar23 * lVar19);
                } while (uVar29 != uVar33);
              }
              fVar38 = fVar37;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar37 <= 0.0) {
                  fVar38 = 0.0;
                }
                break;
              case 2:
                fVar38 = (float)(-(uint)(0.0 < fVar37) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar37) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar37;
                break;
              case 3:
                fVar38 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar37 <= fVar38) {
                  fVar37 = fVar38;
                }
                fVar39 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar38 = fVar37;
                if (fVar39 <= fVar37) {
                  fVar38 = fVar39;
                }
                break;
              case 4:
                fVar37 = expf(-fVar37);
                fVar38 = 1.0 / (fVar37 + 1.0);
                break;
              case 5:
                fVar38 = expf(fVar37);
                fVar38 = logf(fVar38 + 1.0);
                fVar38 = tanhf(fVar38);
                fVar38 = fVar38 * fVar37;
                break;
              case 6:
                fVar39 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar40 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar41 = -fVar40 / fVar39;
                fVar38 = 0.0;
                if ((fVar41 <= fVar37) && (fVar38 = fVar37, fVar37 <= fVar41 + 1.0 / fVar39)) {
                  fVar38 = (fVar39 * fVar37 + fVar40) * fVar37;
                }
              }
              *(float *)((long)pvVar11 + uVar25 * 4 + (long)iVar3 * sVar8 * uVar32) = fVar38;
              uVar25 = uVar25 + 1;
            } while (uVar25 != _w);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != _h);
      }
      iVar26 = 0;
    }
  }
  piVar18 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}